

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O0

Var Js::GlobalObject::EntryEmitTTDLog(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  ScriptContext *pSVar3;
  ThreadContext *pTVar4;
  Var *values;
  undefined4 *puVar5;
  JavascriptLibrary *this;
  Var pvVar6;
  JavascriptBoolean *pJVar7;
  JavascriptString *uriString;
  JavascriptString *jsString;
  JavascriptLibrary *jslib;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar3 = RecyclableObject::GetScriptContext(function);
  pTVar4 = ScriptContext::GetThreadContext(pSVar3);
  pSVar3 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(pTVar4,0xc00,pSVar3,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x675,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader((ArgumentReader *)&jslib,(CallInfo *)&function_local,values);
  pSVar3 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetLibrary(pSVar3);
  if (((uint)jslib & 0xffffff) == 2) {
    pvVar6 = Arguments::operator[]((Arguments *)&jslib,1);
    bVar2 = VarIs<Js::JavascriptString>(pvVar6);
    if (bVar2) {
      pSVar3 = RecyclableObject::GetScriptContext(function);
      bVar2 = ScriptContext::ShouldPerformReplayAction(pSVar3);
      if (bVar2) {
        pSVar3 = RecyclableObject::GetScriptContext(function);
        pTVar4 = ScriptContext::GetThreadContext(pSVar3);
        TTD::EventLog::ReplayEmitLogEvent(pTVar4->TTDLog);
        pJVar7 = JavascriptLibraryBase::GetTrue(&this->super_JavascriptLibraryBase);
        return pJVar7;
      }
      pSVar3 = RecyclableObject::GetScriptContext(function);
      bVar2 = ScriptContext::ShouldPerformRecordAction(pSVar3);
      if (!bVar2) {
        pJVar7 = JavascriptLibraryBase::GetFalse(&this->super_JavascriptLibraryBase);
        return pJVar7;
      }
      pvVar6 = Arguments::operator[]((Arguments *)&jslib,1);
      uriString = VarTo<Js::JavascriptString>(pvVar6);
      pSVar3 = RecyclableObject::GetScriptContext(function);
      pTVar4 = ScriptContext::GetThreadContext(pSVar3);
      TTD::EventLog::RecordEmitLogEvent(pTVar4->TTDLog,uriString);
      pJVar7 = JavascriptLibraryBase::GetTrue(&this->super_JavascriptLibraryBase);
      return pJVar7;
    }
  }
  pJVar7 = JavascriptLibraryBase::GetFalse(&this->super_JavascriptLibraryBase);
  return pJVar7;
}

Assistant:

Var GlobalObject::EntryEmitTTDLog(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);
        ARGUMENTS(args, callInfo);

        Js::JavascriptLibrary* jslib = function->GetScriptContext()->GetLibrary();

        if(args.Info.Count != 2 || !Js::VarIs<Js::JavascriptString>(args[1]))
        {
            return jslib->GetFalse();
        }

        if(function->GetScriptContext()->ShouldPerformReplayAction())
        {
            function->GetScriptContext()->GetThreadContext()->TTDLog->ReplayEmitLogEvent();

            return jslib->GetTrue();
        }

        if(function->GetScriptContext()->ShouldPerformRecordAction())
        {
            Js::JavascriptString* jsString = Js::VarTo<Js::JavascriptString>(args[1]);
            function->GetScriptContext()->GetThreadContext()->TTDLog->RecordEmitLogEvent(jsString);

            return jslib->GetTrue();
        }

        return jslib->GetFalse();
    }